

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

sx_coro_context * sx_coro_create_context(sx_alloc *alloc,int num_initial_fibers,int stack_sz)

{
  code *pcVar1;
  uint uVar2;
  sx_coro_context *psVar3;
  size_t sVar4;
  sx_pool *psVar5;
  ulong uVar6;
  uint uVar7;
  sx__pool_page *__s;
  long lVar8;
  
  if (num_initial_fibers < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xaa,"num_initial_fibers > 0");
    pcVar1 = (code *)swi(3);
    psVar3 = (sx_coro_context *)(*pcVar1)();
    return psVar3;
  }
  sVar4 = sx_os_minstacksz();
  if ((ulong)(long)stack_sz < sVar4) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xab,"stack size too small");
    pcVar1 = (code *)swi(3);
    psVar3 = (sx_coro_context *)(*pcVar1)();
    return psVar3;
  }
  psVar3 = (sx_coro_context *)
           (*alloc->alloc_cb)((void *)0x0,0x30,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
  if (psVar3 == (sx_coro_context *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0xaf);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xaf,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar3 = (sx_coro_context *)(*pcVar1)();
    return psVar3;
  }
  psVar3->run_list_last = (sx__coro_state *)0x0;
  psVar3->cur_coro = (sx__coro_state *)0x0;
  *(undefined8 *)&psVar3->stack_sz = 0;
  psVar3->coro_pool = (sx_pool *)0x0;
  psVar3->run_list = (sx__coro_state *)0x0;
  psVar3->alloc = alloc;
  uVar7 = num_initial_fibers + 0xfU & 0xfffffff0;
  lVar8 = 0;
  psVar5 = (sx_pool *)
           (*alloc->alloc_cb)((void *)0x0,(long)(int)uVar7 * 0x58 | 0x30,0x10,
                              "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c"
                              ,"sx_coro_context *sx_coro_create_context(const sx_alloc *, int, int)"
                              ,0xb6,alloc->user_data);
  if (psVar5 != (sx_pool *)0x0) {
    psVar5->item_sz = 0x50;
    psVar5->capacity = uVar7;
    psVar5->pages = (sx__pool_page *)(psVar5 + 1);
    *(uint *)&psVar5[2].pages = uVar7;
    *(sx_pool **)(psVar5 + 1) = psVar5 + 3;
    __s = (sx__pool_page *)(&psVar5[3].item_sz + (long)(int)uVar7 * 2);
    psVar5[1].pages = __s;
    psVar5[2].item_sz = 0;
    psVar5[2].capacity = 0;
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    uVar2 = uVar7;
    for (; uVar2 = uVar2 - 1, uVar6 * 0x50 - lVar8 != 0; lVar8 = lVar8 + 0x50) {
      *(long *)(*(long *)(psVar5 + 1) + (long)(int)uVar2 * 8) = (long)&__s->ptrs + lVar8;
      __s = psVar5[1].pages;
    }
    memset(__s,0,(long)(int)(uVar7 * 0x50));
    psVar3->coro_pool = psVar5;
    psVar3->stack_sz = stack_sz;
    return psVar3;
  }
  sx__mem_run_fail_callback
            ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",0x5b)
  ;
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                    ,0x5b,"Out of memory");
  pcVar1 = (code *)swi(3);
  psVar3 = (sx_coro_context *)(*pcVar1)();
  return psVar3;
}

Assistant:

sx_coro_context* sx_coro_create_context(const sx_alloc* alloc, int num_initial_fibers, int stack_sz)
{
    sx_assert(num_initial_fibers > 0);
    sx_assertf((size_t)stack_sz >= sx_os_minstacksz(), "stack size too small");

    sx_coro_context* ctx = (sx_coro_context*)sx_malloc(alloc, sizeof(sx_coro_context));
    if (!ctx) {
        sx_out_of_memory();
        return NULL;
    }
    sx_memset(ctx, 0x0, sizeof(sx_coro_context));

    ctx->alloc = alloc;

    ctx->coro_pool = sx_pool_create(alloc, sizeof(sx__coro_state), num_initial_fibers);
    if (!ctx->coro_pool) {
        sx_out_of_memory();
        return NULL;
    }
    ctx->stack_sz = stack_sz;

    return ctx;
}